

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  wchar_t *pwVar5;
  wchar_t wVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  wchar_t *pwVar11;
  long lVar12;
  bool bVar13;
  
  uVar2 = this->abs_value;
  pwVar11 = *it + this->size;
  pwVar5 = pwVar11;
  if (uVar2 < 100) {
    bVar13 = false;
  }
  else {
    iVar8 = -1;
    uVar10 = 1;
    iVar3 = -2;
    uVar4 = 2;
    uVar7 = uVar2;
    do {
      uVar2 = uVar7 / 100;
      uVar1 = (ulong)(uint)(((int)uVar7 + (int)uVar2 * -100) * 2);
      pwVar5[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar1 + 1];
      lVar12 = -4;
      if ((int)(uVar10 / 3) * 3 + iVar8 == 0) {
        pwVar5[-2] = this->sep;
        lVar12 = -8;
      }
      *(int *)((long)pwVar5 + lVar12 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar1];
      if ((int)(uVar4 / 3) * 3 + iVar3 == 0) {
        *(char_type *)((long)pwVar5 + lVar12 + -8) = this->sep;
        lVar12 = lVar12 + -8;
      }
      else {
        lVar12 = lVar12 + -4;
      }
      pwVar5 = (wchar_t *)((long)pwVar5 + lVar12);
      iVar8 = iVar8 + -2;
      uVar9 = (int)uVar10 + 2;
      uVar10 = (ulong)uVar9;
      iVar3 = iVar3 + -2;
      uVar4 = (ulong)((int)uVar4 + 2);
      bVar13 = 9999 < uVar7;
      uVar7 = uVar2;
    } while (bVar13);
    bVar13 = iVar8 + (uVar9 / 3) * 3 == 0;
  }
  if (uVar2 < 10) {
    wVar6 = (uint)uVar2 | 0x30;
  }
  else {
    uVar2 = (uVar2 & 0xffffffff) * 2;
    pwVar5[-1] = (int)(char)internal::basic_data<void>::DIGITS[(uVar2 & 0xffffffff) + 1];
    lVar12 = -4;
    if (bVar13) {
      pwVar5[-2] = this->sep;
      lVar12 = -8;
    }
    pwVar5 = (wchar_t *)((long)pwVar5 + lVar12);
    wVar6 = (wchar_t)(char)internal::basic_data<void>::DIGITS[uVar2];
  }
  pwVar5[-1] = wVar6;
  *it = pwVar11;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = format_decimal(it, abs_value, size,
                            internal::add_thousands_sep<char_type>(s));
      }